

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GuaranteedThroughputProbabilisticSampler.h
# Opt level: O0

SamplingStatus * __thiscall
jaegertracing::samplers::GuaranteedThroughputProbabilisticSampler::isSampled
          (SamplingStatus *__return_storage_ptr__,GuaranteedThroughputProbabilisticSampler *this,
          TraceID *id,string *operation)

{
  bool bVar1;
  pointer pRVar2;
  SamplingStatus local_a0;
  undefined1 local_7d;
  undefined4 local_7c;
  undefined1 local_78 [3];
  bool sampled;
  undefined1 local_48 [8];
  SamplingStatus samplingStatus;
  string *operation_local;
  TraceID *id_local;
  GuaranteedThroughputProbabilisticSampler *this_local;
  
  samplingStatus._tags.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)operation;
  ProbabilisticSampler::isSampled
            ((SamplingStatus *)local_48,&this->_probabilisticSampler,id,operation);
  bVar1 = SamplingStatus::isSampled((SamplingStatus *)local_48);
  if (bVar1) {
    pRVar2 = std::
             unique_ptr<jaegertracing::samplers::RateLimitingSampler,_std::default_delete<jaegertracing::samplers::RateLimitingSampler>_>
             ::operator->(&this->_lowerBoundSampler);
    (*(pRVar2->super_Sampler)._vptr_Sampler[2])
              (local_78,pRVar2,id,
               samplingStatus._tags.
               super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
    SamplingStatus::~SamplingStatus((SamplingStatus *)local_78);
    SamplingStatus::SamplingStatus(__return_storage_ptr__,(SamplingStatus *)local_48);
  }
  else {
    pRVar2 = std::
             unique_ptr<jaegertracing::samplers::RateLimitingSampler,_std::default_delete<jaegertracing::samplers::RateLimitingSampler>_>
             ::operator->(&this->_lowerBoundSampler);
    (*(pRVar2->super_Sampler)._vptr_Sampler[2])
              (&local_a0,pRVar2,id,
               samplingStatus._tags.
               super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
    bVar1 = SamplingStatus::isSampled(&local_a0);
    SamplingStatus::~SamplingStatus(&local_a0);
    local_7d = bVar1;
    SamplingStatus::SamplingStatus(__return_storage_ptr__,bVar1,&this->_tags);
  }
  local_7c = 1;
  SamplingStatus::~SamplingStatus((SamplingStatus *)local_48);
  return __return_storage_ptr__;
}

Assistant:

SamplingStatus isSampled(const TraceID& id,
                             const std::string& operation) override
    {
        const auto samplingStatus =
            _probabilisticSampler.isSampled(id, operation);
        if (samplingStatus.isSampled()) {
            _lowerBoundSampler->isSampled(id, operation);
            return samplingStatus;
        }
        const auto sampled =
            _lowerBoundSampler->isSampled(id, operation).isSampled();
        return SamplingStatus(sampled, _tags);
    }